

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O1

Gia_Man_t * Gls_ManConstruct(Gls_Man_t *p,char *pFileName)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  Vec_Int_t *vMemory;
  Vec_Int_t *p_00;
  int *piVar8;
  Gia_Man_t *p_01;
  size_t sVar9;
  char *pcVar10;
  undefined4 *__s;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  word Truth;
  word local_38;
  
  vMemory = (Vec_Int_t *)malloc(0x10);
  p_00 = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0;
  vMemory->nSize = 0;
  vMemory->pArray = (int *)0x0;
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar8 = (int *)malloc(0x40);
  p_00->pArray = piVar8;
  p_01 = Gia_ManStart(p->vTypes->nSize);
  if (pFileName == (char *)0x0) {
    p_01->pName = (char *)0x0;
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pFileName);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pFileName);
    p_01->pName = pcVar10;
    sVar9 = strlen(pFileName);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pFileName);
  }
  p_01->pSpec = pcVar10;
  uVar2 = p->vTypes->nSize;
  uVar6 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar6 = uVar2;
  }
  if (uVar6 == 0) {
    __s = (undefined4 *)0x0;
  }
  else {
    __s = (undefined4 *)malloc((long)(int)uVar6 << 2);
  }
  if (__s != (undefined4 *)0x0) {
    memset(__s,0xff,(long)(int)uVar2 * 4);
  }
  if (((int)uVar2 < 1) || (*__s = 0, uVar2 == 1)) {
LAB_00742f1e:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  __s[1] = 1;
  pVVar12 = p->vOrderPis;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      uVar6 = pVVar12->pArray[lVar14];
      pGVar11 = Gia_ManAppendObj(p_01);
      uVar13 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_01->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_01->nObjs <= pGVar11)) goto LAB_00742ee0;
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_01->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_01->nObjs <= pGVar11)) goto LAB_00742ee0;
      if (uVar2 <= uVar6) goto LAB_00742f1e;
      __s[uVar6] = (int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar12 = p->vOrderPis;
    } while (lVar14 < pVVar12->nSize);
  }
  pVVar12 = p->vOrderBoxes;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      uVar6 = pVVar12->pArray[lVar14];
      pGVar11 = Gia_ManAppendObj(p_01);
      uVar13 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_01->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_01->nObjs <= pGVar11)) goto LAB_00742ee0;
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_01->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_01->nObjs <= pGVar11)) goto LAB_00742ee0;
      if (uVar2 <= uVar6) goto LAB_00742f1e;
      __s[uVar6] = (int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar12 = p->vOrderBoxes;
    } while (lVar14 < pVVar12->nSize);
  }
  pVVar12 = p->vOrderDelays;
  if (0 < pVVar12->nSize) {
    uVar13 = 0;
    do {
      iVar3 = pVVar12->pArray[uVar13];
      lVar14 = (long)iVar3;
      if ((lVar14 < 0) || (p->vIndexes->nSize <= iVar3)) goto LAB_00742eff;
      if (uVar13 != (uint)p->vIndexes->pArray[lVar14]) {
        __assert_fail("Index == Vec_IntEntry(p->vIndexes, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGig.c"
                      ,0x195,"Gia_Man_t *Gls_ManConstruct(Gls_Man_t *, char *)");
      }
      if ((long)p->vDelayOuts->nSize <= (long)uVar13) goto LAB_00742f5c;
      pVVar12 = p->vDelayOuts->pArray;
      if (pVVar12[uVar13].nSize == 0) {
        pGVar11 = Gia_ManAppendObj(p_01);
        uVar5 = *(ulong *)pGVar11;
        *(ulong *)pGVar11 = uVar5 | 0x9fffffff;
        *(ulong *)pGVar11 =
             uVar5 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_01->pObjs;
        if ((pGVar11 < pGVar4) || (pGVar4 + p_01->nObjs <= pGVar11)) {
LAB_00742ee0:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_01->pObjs;
        if ((pGVar11 < pGVar4) || (pGVar4 + p_01->nObjs <= pGVar11)) goto LAB_00742ee0;
        if ((int)uVar2 <= iVar3) goto LAB_00742f1e;
        __s[lVar14] = (int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * 0x55555556;
      }
      else if (0 < pVVar12[uVar13].nSize) {
        lVar14 = 0;
        do {
          uVar6 = pVVar12[uVar13].pArray[lVar14];
          pGVar11 = Gia_ManAppendObj(p_01);
          uVar5 = *(ulong *)pGVar11;
          *(ulong *)pGVar11 = uVar5 | 0x9fffffff;
          *(ulong *)pGVar11 =
               uVar5 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p_01->pObjs;
          if ((pGVar11 < pGVar4) || (pGVar4 + p_01->nObjs <= pGVar11)) goto LAB_00742ee0;
          Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_01->pObjs;
          if ((pGVar11 < pGVar4) || (pGVar4 + p_01->nObjs <= pGVar11)) goto LAB_00742ee0;
          if (uVar2 <= uVar6) goto LAB_00742f1e;
          __s[uVar6] = (int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * 0x55555556;
          lVar14 = lVar14 + 1;
        } while (lVar14 < pVVar12[uVar13].nSize);
      }
      uVar13 = uVar13 + 1;
      pVVar12 = p->vOrderDelays;
    } while ((long)uVar13 < (long)pVVar12->nSize);
  }
  pVVar12 = p->vOrderLuts;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      iVar3 = pVVar12->pArray[lVar14];
      lVar15 = (long)iVar3;
      if ((lVar15 < 0) || (p->vTypes->nSize <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      bVar1 = p->vTypes->pArray[lVar15];
      if ((byte)(bVar1 - 7) < 2) {
        if (p->vIndexes->nSize <= iVar3) goto LAB_00742eff;
        uVar6 = p->vIndexes->pArray[lVar15];
        if (bVar1 == 7) {
          if ((int)uVar6 < 0) goto LAB_00742f7b;
          uVar17 = uVar6 * 4;
          pVVar12 = p->vLut4s;
        }
        else {
          if ((int)uVar6 < 0) goto LAB_00742f7b;
          uVar17 = uVar6 * 6;
          pVVar12 = p->vLut6s;
        }
        if (pVVar12->nSize <= (int)uVar17) {
LAB_00742f7b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar8 = pVVar12->pArray;
        if (bVar1 == 7) {
          if (((int)uVar6 < 0) || (p->vLut4TTs->nSize <= (int)uVar6)) goto LAB_00742eff;
          local_38 = (word)p->vLut4TTs->pArray[uVar6];
          lVar18 = 4;
        }
        else {
          if (((int)uVar6 < 0) || (p->vLut6TTs->nSize <= (int)uVar6)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
          }
          local_38 = p->vLut6TTs->pArray[uVar6];
          lVar18 = 6;
        }
        p_00->nSize = 0;
        lVar16 = 0;
        do {
          uVar6 = piVar8[(ulong)uVar17 + lVar16];
          if ((ulong)uVar6 == 0xffffffff) {
            iVar7 = 0;
          }
          else {
            if (uVar2 <= uVar6) goto LAB_00742eff;
            iVar7 = __s[uVar6];
          }
          Vec_IntPush(p_00,iVar7);
          lVar16 = lVar16 + 1;
        } while (lVar18 != lVar16);
        iVar7 = Kit_TruthToGia(p_01,(uint *)&local_38,p_00->nSize,vMemory,p_00,0);
        if ((int)uVar2 <= iVar3) goto LAB_00742f1e;
        __s[lVar15] = iVar7;
      }
      else if ((bVar1 & 0xfd) == 4) {
        if ((p->vIndexes->nSize <= iVar3) || (uVar6 = p->vIndexes->pArray[lVar15], uVar2 <= uVar6))
        goto LAB_00742eff;
        if ((int)uVar2 <= iVar3) goto LAB_00742f1e;
        __s[lVar15] = __s[uVar6];
      }
      lVar14 = lVar14 + 1;
      pVVar12 = p->vOrderLuts;
    } while (lVar14 < pVVar12->nSize);
  }
  if (0 < p->vOrderDelays->nSize) {
    lVar14 = 0;
    do {
      if (p->vDelayIns->nSize <= lVar14) {
LAB_00742f5c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar12 = p->vDelayIns->pArray;
      if (pVVar12[lVar14].nSize < 1) {
        __assert_fail("Vec_IntSize(vArray) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGig.c"
                      ,0x1b7,"Gia_Man_t *Gls_ManConstruct(Gls_Man_t *, char *)");
      }
      if (0 < pVVar12[lVar14].nSize) {
        lVar15 = 0;
        do {
          if (uVar2 <= (uint)pVVar12[lVar14].pArray[lVar15]) goto LAB_00742eff;
          Gia_ManAppendCo(p_01,__s[(uint)pVVar12[lVar14].pArray[lVar15]]);
          lVar15 = lVar15 + 1;
        } while (lVar15 < pVVar12[lVar14].nSize);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < p->vOrderDelays->nSize);
  }
  pVVar12 = p->vOrderPos;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      iVar3 = pVVar12->pArray[lVar14];
      if ((((long)iVar3 < 0) || (p->vIndexes->nSize <= iVar3)) ||
         (uVar6 = p->vIndexes->pArray[iVar3], uVar2 <= uVar6)) goto LAB_00742eff;
      Gia_ManAppendCo(p_01,__s[uVar6]);
      lVar14 = lVar14 + 1;
      pVVar12 = p->vOrderPos;
    } while (lVar14 < pVVar12->nSize);
  }
  pVVar12 = p->vOrderSeqs;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      iVar3 = pVVar12->pArray[lVar14];
      if ((((long)iVar3 < 0) || (p->vIndexes->nSize <= iVar3)) ||
         (uVar6 = p->vIndexes->pArray[iVar3], uVar2 <= uVar6)) {
LAB_00742eff:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Gia_ManAppendCo(p_01,__s[uVar6]);
      lVar14 = lVar14 + 1;
      pVVar12 = p->vOrderSeqs;
    } while (lVar14 < pVVar12->nSize);
  }
  free(__s);
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
    vMemory->pArray = (int *)0x0;
  }
  free(vMemory);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  return p_01;
}

Assistant:

Gia_Man_t * Gls_ManConstruct( Gls_Man_t * p, char * pFileName )
{
    extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
    Gia_Man_t * pGia = NULL;  
    Vec_Int_t * vMap, * vArray;
    Vec_Int_t * vCover = Vec_IntAlloc(0);
    Vec_Int_t * vLeaves = Vec_IntAlloc(6);
    int  k, iObj, iLit, Index;  char Type;
    // create new manager
    pGia = Gia_ManStart( Vec_StrSize(p->vTypes) );
    pGia->pName = Abc_UtilStrsav( pFileName );
    pGia->pSpec = Abc_UtilStrsav( pFileName );
    // create constants
    vMap = Vec_IntStartFull( Vec_StrSize(p->vTypes) );
    Vec_IntWriteEntry( vMap, 0, 0 );
    Vec_IntWriteEntry( vMap, 1, 1 );
    // create primary inputs
    Vec_IntForEachEntry( p->vOrderPis, iObj, k )
        Vec_IntWriteEntry( vMap, iObj, Gia_ManAppendCi(pGia) );
    // create box outputs
    Vec_IntForEachEntry( p->vOrderBoxes, iObj, k )
        Vec_IntWriteEntry( vMap, iObj, Gia_ManAppendCi(pGia) );
    // create delay outputs
    Vec_IntForEachEntry( p->vOrderDelays, iObj, Index )
    {
        assert( Index == Vec_IntEntry(p->vIndexes, iObj) );
        vArray = Vec_WecEntry(p->vDelayOuts, Index);
        if ( Vec_IntSize(vArray) == 0 )
            Vec_IntWriteEntry( vMap, iObj, Gia_ManAppendCi(pGia) );
        else
            Vec_IntForEachEntry( vArray, iObj, k )
                Vec_IntWriteEntry( vMap, iObj, Gia_ManAppendCi(pGia) );
    }
    // construct LUTs
    Vec_IntForEachEntry( p->vOrderLuts, iObj, Index )
    {
        Type = Vec_StrEntry( p->vTypes, iObj );
        if ( Type == GLS_LUT4 || Type == GLS_LUT6 )
        {
            int Limit = Type == GLS_LUT4 ? 4 : 6;
            int Index = Vec_IntEntry(p->vIndexes, iObj);
            int * pFanins = Type == GLS_LUT4 ? Vec_IntEntryP(p->vLut4s, 4*Index) : Vec_IntEntryP(p->vLut6s, 6*Index);
            word Truth = Type == GLS_LUT4 ? (word)Vec_IntEntry(p->vLut4TTs, Index) : Vec_WrdEntry(p->vLut6TTs, Index);
            Vec_IntClear( vLeaves );
            for ( k = 0; k < Limit; k++ )
                Vec_IntPush( vLeaves, pFanins[k] == GLS_NONE ? 0 : Vec_IntEntry(vMap, pFanins[k]) );
            iLit = Kit_TruthToGia( pGia, (unsigned *)&Truth, Vec_IntSize(vLeaves), vCover, vLeaves, 0 );
            Vec_IntWriteEntry( vMap, iObj, iLit );
        }
        else if ( Type == GLS_BAR || Type == GLS_SEL )
        {
            iLit = Vec_IntEntry( vMap, Vec_IntEntry(p->vIndexes, iObj) );
            Vec_IntWriteEntry( vMap, iObj, iLit );
        }
    }
    // delay inputs
    Vec_IntForEachEntry( p->vOrderDelays, iObj, Index )
    {
        vArray = Vec_WecEntry(p->vDelayIns, Index);
        assert( Vec_IntSize(vArray) > 0 );
        Vec_IntForEachEntry( vArray, iObj, k )
            Gia_ManAppendCo( pGia, Vec_IntEntry(vMap, iObj) );
    }
    // create primary outputs
    Vec_IntForEachEntry( p->vOrderPos, iObj, k )
        Gia_ManAppendCo( pGia, Vec_IntEntry(vMap, Vec_IntEntry(p->vIndexes, iObj)) );
    // create sequential nodes
    Vec_IntForEachEntry( p->vOrderSeqs, iObj, k )
        Gia_ManAppendCo( pGia, Vec_IntEntry(vMap, Vec_IntEntry(p->vIndexes, iObj)) );
    Vec_IntFree( vMap );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // print delay boxes
//    for ( k = 0; k < Vec_IntSize(p->vDelays); k++ )
//        printf( "%d:%d  ", Vec_IntSize(Vec_WecEntry(p->vDelayIns, k)), Vec_IntSize(Vec_WecEntry(p->vDelayOuts, k)) );
//    printf( "\n" );
    return pGia;
}